

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int ERKStepGetTimestepperStats
              (void *arkode_mem,long *expsteps,long *accsteps,long *attempts,long *fevals,
              long *netfails)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  int retval;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  undefined8 local_40;
  undefined4 local_4;
  
  local_4 = erkStep_AccessStepMem
                      (in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,(ARKodeERKStepMem *)0xea487d);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)(*(long *)(local_40 + 0x1b0) + 0xd8);
    *in_RDX = *(undefined8 *)(*(long *)(local_40 + 0x1b0) + 0xd0);
    *in_RCX = *(undefined8 *)(local_40 + 0x1d0);
    *in_R8 = *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x28);
    *in_R9 = *(undefined8 *)(local_40 + 0x1f0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ERKStepGetTimestepperStats(void *arkode_mem, long int *expsteps,
                               long int *accsteps, long int *attempts,
                               long int *fevals, long int *netfails)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepGetTimestepperStats",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* set expsteps and accsteps from adaptivity structure */
  *expsteps = ark_mem->hadapt_mem->nst_exp;
  *accsteps = ark_mem->hadapt_mem->nst_acc;

  /* set remaining outputs */
  *attempts = ark_mem->nst_attempts;
  *fevals   = step_mem->nfe;
  *netfails = ark_mem->netf;

  return(ARK_SUCCESS);
}